

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

void * raviX_realloc(void *p,size_t size)

{
  void *pvVar1;
  void *ptr;
  size_t size_local;
  void *p_local;
  
  pvVar1 = realloc(p,size);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  return pvVar1;
}

Assistant:

void *raviX_realloc(void *p, size_t size)
{
	void *ptr;
	ptr = realloc(p, size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}